

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbasictimer.h
# Opt level: O1

void __thiscall
QGraphicsSceneBspTreeIndexPrivate::startIndexTimer
          (QGraphicsSceneBspTreeIndexPrivate *this,int interval)

{
  if ((this->indexTimer).m_id != Invalid) {
    this->restartIndexTimer = true;
    return;
  }
  QBasicTimer::start(&this->indexTimer,(long)interval * 1000000,1,
                     *(undefined8 *)&(this->super_QGraphicsSceneIndexPrivate).field_0x8);
  return;
}

Assistant:

bool isActive() const noexcept { return m_id != Qt::TimerId::Invalid; }